

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void __thiscall VmFunction::MoveEntryBlockToStart(VmFunction *this)

{
  uint uVar1;
  VmValue **ppVVar2;
  uint local_24;
  VmBlock *pVStack_20;
  uint i;
  VmBlock *curr;
  VmBlock *entryBlock;
  VmFunction *this_local;
  
  if (this->firstBlock != (VmBlock *)0x0) {
    curr = (VmBlock *)0x0;
    for (pVStack_20 = this->firstBlock; pVStack_20 != (VmBlock *)0x0;
        pVStack_20 = pVStack_20->nextSibling) {
      for (local_24 = 0; uVar1 = SmallArray<VmValue_*,_8U>::size(&(pVStack_20->super_VmValue).users)
          , local_24 < uVar1; local_24 = local_24 + 1) {
        ppVVar2 = SmallArray<VmValue_*,_8U>::operator[](&(pVStack_20->super_VmValue).users,local_24)
        ;
        if ((VmFunction *)*ppVVar2 == this) {
          curr = pVStack_20;
          break;
        }
      }
      if (curr != (VmBlock *)0x0) break;
    }
    if (curr == (VmBlock *)0x0) {
      __assert_fail("entryBlock",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x86b,"void VmFunction::MoveEntryBlockToStart()");
    }
    if (this->firstBlock != curr) {
      DetachBlock(this,curr);
      if (this->firstBlock == (VmBlock *)0x0) {
        this->lastBlock = curr;
        this->firstBlock = curr;
      }
      else {
        this->firstBlock->prevSibling = curr;
        curr->nextSibling = this->firstBlock;
        this->firstBlock = curr;
      }
      curr->parent = this;
    }
  }
  return;
}

Assistant:

void VmFunction::MoveEntryBlockToStart()
{
	if(!firstBlock)
		return;

	// Function must start from the first block
	VmBlock *entryBlock = NULL;

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			if(curr->users[i] == this)
			{
				entryBlock = curr;
				break;
			}
		}

		if(entryBlock)
			break;
	}

	assert(entryBlock);

	if(firstBlock != entryBlock)
	{
		// Detach entry block
		DetachBlock(entryBlock);

		// Re-attach to front
		if(!firstBlock)
		{
			firstBlock = lastBlock = entryBlock;
		}
		else
		{
			firstBlock->prevSibling = entryBlock;
			entryBlock->nextSibling = firstBlock;
			firstBlock = entryBlock;
		}

		entryBlock->parent = this;
	}
}